

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void random_fe_non_zero(secp256k1_fe *nz)

{
  uint32_t uVar1;
  long lVar2;
  uint64_t *t;
  int iVar3;
  long lVar4;
  secp256k1_fe *r;
  undefined1 auVar5 [16];
  
  iVar3 = -0xb;
  r = nz;
  do {
    iVar3 = iVar3 + 1;
    if (iVar3 == 0) {
      random_fe_non_zero_cold_1();
      uVar1 = secp256k1_testrand_int(9);
      secp256k1_fe_impl_normalize(r);
      if (uVar1 != 0) {
        lVar2 = (long)(int)(uVar1 - 1);
        lVar4 = (lVar2 << 0x35) + lVar2 * -2;
        r->n[0] = r->n[0] + lVar2 * 0x1ffffdfffff85e;
        auVar5._8_4_ = (int)lVar4;
        auVar5._0_8_ = lVar4;
        auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
        r->n[1] = lVar4 + r->n[1];
        r->n[2] = auVar5._8_8_ + r->n[2];
        r->n[3] = r->n[3] + lVar4;
        r->n[4] = r->n[4] + (lVar2 << 0x31) + lVar2 * -2;
      }
      return;
    }
    random_fe(nz);
    r = nz;
    secp256k1_fe_impl_normalize(nz);
  } while (((nz->n[3] == 0 && nz->n[1] == 0) && (nz->n[2] == 0 && nz->n[0] == 0)) && nz->n[4] == 0);
  return;
}

Assistant:

static void random_fe_non_zero(secp256k1_fe *nz) {
    int tries = 10;
    while (--tries >= 0) {
        random_fe(nz);
        secp256k1_fe_normalize(nz);
        if (!secp256k1_fe_is_zero(nz)) {
            break;
        }
    }
    /* Infinitesimal probability of spurious failure here */
    CHECK(tries >= 0);
}